

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latexOutline.cpp
# Opt level: O0

vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *
getOutlineForLatexFile
          (vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *__return_storage_ptr__,
          File *file)

{
  TSNode node;
  byte bVar1;
  Point endPoint;
  byte local_81;
  undefined1 auStack_40 [8];
  TSNode rootNode;
  bool recursive;
  File *file_local;
  vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *outline;
  
  local_81 = 0;
  if (file->type == Tex) {
    local_81 = file->hasParser;
  }
  if ((local_81 & 1) != 0) {
    rootNode.tree._7_1_ = (g_config->latex).outline.deepSearch & 1;
    rootNode.tree._6_1_ = 0;
    (__return_storage_ptr__->super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<DocumentSymbol,_std::allocator<DocumentSymbol>_>::vector(__return_storage_ptr__);
    File::getRootNode((TSNode *)auStack_40,file);
    bVar1 = rootNode.tree._7_1_;
    endPoint = File::getEndPoint(file);
    node.context[2] = rootNode.context[0];
    node.context[3] = rootNode.context[1];
    node.context[0] = auStack_40._0_4_;
    node.context[1] = auStack_40._4_4_;
    node.id = (void *)rootNode.context._8_8_;
    node.tree = (TSTree *)rootNode.id;
    generateOutline(__return_storage_ptr__,node,file,(bool)(bVar1 & 1),endPoint);
    return __return_storage_ptr__;
  }
  __assert_fail("file.type == File::Type::Tex && file.hasParser",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/src/handlers/outline/latexOutline.cpp"
                ,0x11d,"vector<DocumentSymbol> getOutlineForLatexFile(File &)");
}

Assistant:

vector<DocumentSymbol> getOutlineForLatexFile (File &file) {
    assert(file.type == File::Type::Tex && file.hasParser);

    bool recursive = g_config->latex.outline.deepSearch;

    vector<DocumentSymbol> outline {};

    TSNode rootNode = file.getRootNode();

    generateOutline(outline, rootNode, file, recursive, file.getEndPoint());

    return outline;
}